

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall gss::innards::Proof::create_objective(Proof *this,int n,optional<int> d)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  ulong uVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  ulong local_40;
  _Optional_payload_base<int> local_38;
  
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  uVar2 = (ulong)(uint)n;
  if (((ulong)d.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
       >> 0x20 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(_Var1._M_head_impl)->field_0x1d8,"min:",4);
    if (n < 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  field_0x1d8," ;\n",3);
      return;
    }
    local_38._M_payload._M_value = n;
    uVar6 = 0;
    do {
      poVar4 = (ostream *)
               &((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                field_0x1d8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," 1 ~x",5);
      local_40 = uVar6;
      pmVar3 = std::
               map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->binary_variable_mappings,(key_type_conflict *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                field_0x1d8," ;\n",3);
    if (0 < (int)local_38._M_payload) {
      uVar6 = 0;
      do {
        poVar4 = (ostream *)
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  field_0x558;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," 1 ~x",5);
        local_40 = uVar6;
        pmVar3 = std::
                 map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->binary_variable_mappings,
                              (key_type_conflict *)&local_40);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
  }
  else {
    local_38 = (_Optional_payload_base<int>)
               d.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(_Var1._M_head_impl)->field_0x50,"* objective\n",0xc);
    if (0 < n) {
      uVar6 = 0;
      do {
        poVar4 = (ostream *)
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  field_0x50;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"1 x",3);
        local_40 = uVar6;
        pmVar3 = std::
                 map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->binary_variable_mappings,
                              (key_type_conflict *)&local_40);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
    poVar4 = (ostream *)
             &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,">= ",3);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_38._M_payload._M_value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    lVar5 = (_Var1._M_head_impl)->nb_constraints + 1;
    (_Var1._M_head_impl)->nb_constraints = lVar5;
    (_Var1._M_head_impl)->objective_line = lVar5;
  }
  return;
}

Assistant:

auto Proof::create_objective(int n, optional<int> d) -> void
{
    if (d) {
        _imp->model_stream << "* objective\n";
        for (int v = 0; v < n; ++v)
            _imp->model_stream << "1 x" << _imp->binary_variable_mappings[v] << " ";
        _imp->model_stream << ">= " << *d << ";\n";
        _imp->objective_line = ++_imp->nb_constraints;
    }
    else {
        _imp->model_prelude_stream << "min:";
        for (int v = 0; v < n; ++v)
            _imp->model_prelude_stream << " 1 ~x" << _imp->binary_variable_mappings[v];
        _imp->model_prelude_stream << " ;\n";

        for (int v = 0; v < n; ++v)
            _imp->objective_sum << " 1 ~x" << _imp->binary_variable_mappings[v];
    }
}